

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int GetMacroArgumentValue(char **src,char **dst)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *badValueMessage;
  char *pcVar4;
  byte bVar5;
  bool bVar6;
  bool local_75;
  array<EDelimiterType,_3UL> *local_70;
  char endCh;
  char nextC;
  char prevC;
  EDelimiterType local_3c;
  char *pcStack_38;
  EDelimiterType delI;
  char *dstStopTrim;
  char *srcOrig;
  char *dstOrig;
  char **dst_local;
  char **src_local;
  
  SkipBlanks(src);
  pcVar3 = *dst;
  badValueMessage = *src;
  pcStack_38 = *dst;
LAB_00139fea:
  while( true ) {
    bVar6 = false;
    if (**src != '\0') {
      bVar6 = **src != ',';
    }
    if (!bVar6) {
      while( true ) {
        local_75 = false;
        if (pcStack_38 < *dst) {
          local_75 = White((*dst)[-1]);
        }
        if (local_75 == false) break;
        *dst = *dst + -1;
      }
      **dst = '\0';
      if (*pcVar3 == '\0') {
        Warning("[Macro argument parser] empty value",badValueMessage,W_PASS3);
      }
      return 1;
    }
    if (badValueMessage == *src) {
      local_70 = &delimiters_all;
    }
    else {
      local_70 = &delimiters_noAngle;
    }
    local_3c = DelimiterBegins(src,(array<EDelimiterType,_3UL>)*&local_70->_M_elems,false);
    if ((((local_3c == DT_APOSTROPHE) && (badValueMessage < *src)) &&
        (((bVar5 = (*src)[-1] | 0x20, '/' < (char)bVar5 && ((char)bVar5 < ':')) ||
         (('`' < (char)bVar5 && ((char)bVar5 < 'g')))))) &&
       (((bVar5 = (*src)[1] | 0x20, '/' < (char)bVar5 && ((char)bVar5 < ':')) ||
        (('`' < (char)bVar5 && ((char)bVar5 < 'g')))))) {
      local_3c = DT_NONE;
    }
    if (local_3c != DT_NONE) break;
    pcVar4 = *src;
    *src = pcVar4 + 1;
    cVar1 = *pcVar4;
    pcVar4 = *dst;
    *dst = pcVar4 + 1;
    *pcVar4 = cVar1;
  }
  if (local_3c != DT_ANGLE) {
    cVar1 = **src;
    pcVar4 = *dst;
    *dst = pcVar4 + 1;
    *pcVar4 = cVar1;
  }
  *src = *src + 1;
  cVar1 = " \"\'>"[local_3c];
LAB_0013a19d:
  if (**src == '\0') goto LAB_0013a3a1;
  if (local_3c == DT_QUOTES) {
    if ((**src == '\\') && ((*src)[1] != '\0')) {
      pcVar4 = *src;
      *src = pcVar4 + 1;
      cVar2 = *pcVar4;
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar2;
      pcVar4 = *src;
      *src = pcVar4 + 1;
      cVar2 = *pcVar4;
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar2;
      goto LAB_0013a19d;
    }
  }
  else {
    if (local_3c == DT_APOSTROPHE) {
      if ((**src != '\'') || ((*src)[1] != '\'')) goto LAB_0013a362;
      pcVar4 = *src;
      *src = pcVar4 + 1;
      cVar2 = *pcVar4;
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar2;
      pcVar4 = *src;
      *src = pcVar4 + 1;
      cVar2 = *pcVar4;
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar2;
      goto LAB_0013a19d;
    }
    if (local_3c != DT_ANGLE) {
      Error("Internal error. GetMacroArgumentValue()",(char *)0x0,FATAL);
      goto LAB_0013a362;
    }
    if (((**src == '!') && ((*src)[1] == '!')) || ((**src == '!' && ((*src)[1] == '>')))) {
      cVar2 = (*src)[1];
      pcVar4 = *dst;
      *dst = pcVar4 + 1;
      *pcVar4 = cVar2;
      *src = *src + 2;
      goto LAB_0013a19d;
    }
  }
LAB_0013a362:
  if (cVar1 == **src) goto LAB_0013a3a1;
  pcVar4 = *src;
  *src = pcVar4 + 1;
  cVar2 = *pcVar4;
  pcVar4 = *dst;
  *dst = pcVar4 + 1;
  *pcVar4 = cVar2;
  goto LAB_0013a19d;
LAB_0013a3a1:
  if (cVar1 != **src) {
    **dst = '\0';
    return 0;
  }
  if ((local_3c == DT_QUOTES) || (local_3c == DT_APOSTROPHE)) {
    pcVar4 = *dst;
    *dst = pcVar4 + 1;
    *pcVar4 = cVar1;
  }
  pcStack_38 = *dst;
  *src = *src + 1;
  goto LAB_00139fea;
}

Assistant:

int GetMacroArgumentValue(char* & src, char* & dst) {
	SkipBlanks(src);
	const char* const dstOrig = dst, * const srcOrig = src;
	const char* dstStopTrim = dst;
	while (*src && ',' != *src) {
		// check if there is some kind of delimiter next (string literal or angle brackets expression)
		// the angle-bracket can only be used around whole argument (i.e. '<' must be first char)
		EDelimiterType delI = DelimiterBegins(src, srcOrig==src ? delimiters_all : delimiters_noAngle, false);
		// CPP numeric literals heuristic (eating digit-group apostrophes as regular digit char)
		if (DT_APOSTROPHE == delI && srcOrig < src) {
			const char prevC = 0x20 | src[-1];	// also lowercase any ASCII letter
			if (('0' <= prevC && prevC <= '9') || ('a' <= prevC && prevC <= 'f')) {
				// ahead of apostrophe is character which can work as digit (up to hexa system)
				// this heuristic doesn't bother to be super precise, because string-apostrophe
				// should be on word boundary any way, not preceded by *any* digit of any base.
				const char nextC = 0x20 | src[1];
				if (('0' <= nextC && nextC <= '9') || ('a' <= nextC && nextC <= 'f')) {
					// by same logic, if also char after the apostrophe is any digit (up to base16)
					// turn the apostrophe from delimiter into digit-grouping char
					delI = DT_NONE;
				}
			}
		}
		if (DT_NONE == delI) {		// no delimiter found, ordinary expression, copy char by char
			*dst++ = *src++;
			continue;
		}
		// some delimiter found - parse those properly by their type
		if (DT_ANGLE != delI) *dst++ = *src;	// quotes are part of parsed value, angles are NOT
		++src;									// advance over delimiter
		const char endCh = delimiters_e[delI];	// set expected ending delimiter
		while (*src) {
			// handle escape sequences by the type of delimiter
			switch (delI) {
			case DT_ANGLE:
				if (('!' == *src && '!' == src[1]) || ('!' == *src && '>' == src[1])) {
					*dst++ = src[1]; src += 2;	// escape sequence is converted into final char
					continue;
				}
				break;
			case DT_QUOTES:
				if ('\\' == *src && src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy escape + escaped char (*any* non zero char)
				}
				break;
			case DT_APOSTROPHE:
				if ('\'' == *src && '\'' == src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy two apostrophes (escaped apostrophe)
				}
				break;
			default:	Error("Internal error. GetMacroArgumentValue()", NULL, FATAL);
			}
			if (endCh == *src) break;			// ending delimiter found
			*dst++ = *src++;					// just copy character
		}
		// ending delimiter must be identical to endCh
		if (endCh != *src) {
			*dst = 0;							// zero terminator of resulting string value
			return 0;
		}
		// set ending delimiter for quotes and apostrophe (angles are stripped from value)
		if (DT_QUOTES == delI || DT_APOSTROPHE == delI) *dst++ = endCh;
		dstStopTrim = dst;						// should not trim right spaces beyond this point
		++src;									// advance over delimiter
	}
	while (dstStopTrim < dst && White(dst[-1])) --dst;	// trim the right size space from value
	*dst = 0;									// zero terminator of resulting string value
	if (! *dstOrig) Warning("[Macro argument parser] empty value", srcOrig);
	return 1;
}